

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.cpp
# Opt level: O0

shared_ptr<apache::thrift::TProcessor> __thiscall
jaegertracing::thrift::AggregationValidatorProcessorFactory::getProcessor
          (AggregationValidatorProcessorFactory *this,TConnectionInfo *connInfo)

{
  element_type *peVar1;
  AggregationValidatorIf *__p;
  AggregationValidatorProcessor *this_00;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<apache::thrift::TProcessor> sVar2;
  shared_ptr<jaegertracing::thrift::AggregationValidatorIf> local_78;
  undefined1 local_61;
  ReleaseHandler<jaegertracing::thrift::AggregationValidatorIfFactory> local_60 [2];
  undefined1 local_40 [8];
  shared_ptr<jaegertracing::thrift::AggregationValidatorIf> handler;
  ReleaseHandler<jaegertracing::thrift::AggregationValidatorIfFactory> cleanup;
  TConnectionInfo *connInfo_local;
  AggregationValidatorProcessorFactory *this_local;
  shared_ptr<apache::thrift::TProcessor> *processor;
  
  apache::thrift::ReleaseHandler<jaegertracing::thrift::AggregationValidatorIfFactory>::
  ReleaseHandler((ReleaseHandler<jaegertracing::thrift::AggregationValidatorIfFactory> *)
                 &handler.
                  super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (shared_ptr<jaegertracing::thrift::AggregationValidatorIfFactory> *)(connInfo + 8))
  ;
  peVar1 = std::
           __shared_ptr_access<jaegertracing::thrift::AggregationValidatorIfFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::thrift::AggregationValidatorIfFactory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(connInfo + 8));
  __p = (AggregationValidatorIf *)(**(code **)(*(long *)peVar1 + 0x10))(peVar1,in_RDX);
  apache::thrift::ReleaseHandler<jaegertracing::thrift::AggregationValidatorIfFactory>::
  ReleaseHandler(local_60,(ReleaseHandler<jaegertracing::thrift::AggregationValidatorIfFactory> *)
                          &handler.
                           super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
  std::shared_ptr<jaegertracing::thrift::AggregationValidatorIf>::
  shared_ptr<jaegertracing::thrift::AggregationValidatorIf,apache::thrift::ReleaseHandler<jaegertracing::thrift::AggregationValidatorIfFactory>,void>
            ((shared_ptr<jaegertracing::thrift::AggregationValidatorIf> *)local_40,__p,local_60);
  apache::thrift::ReleaseHandler<jaegertracing::thrift::AggregationValidatorIfFactory>::
  ~ReleaseHandler(local_60);
  local_61 = 0;
  this_00 = (AggregationValidatorProcessor *)operator_new(0x58);
  std::shared_ptr<jaegertracing::thrift::AggregationValidatorIf>::shared_ptr
            (&local_78,(shared_ptr<jaegertracing::thrift::AggregationValidatorIf> *)local_40);
  AggregationValidatorProcessor::AggregationValidatorProcessor(this_00,&local_78);
  std::shared_ptr<apache::thrift::TProcessor>::
  shared_ptr<jaegertracing::thrift::AggregationValidatorProcessor,void>
            ((shared_ptr<apache::thrift::TProcessor> *)this,this_00);
  std::shared_ptr<jaegertracing::thrift::AggregationValidatorIf>::~shared_ptr(&local_78);
  local_61 = 1;
  std::shared_ptr<jaegertracing::thrift::AggregationValidatorIf>::~shared_ptr
            ((shared_ptr<jaegertracing::thrift::AggregationValidatorIf> *)local_40);
  apache::thrift::ReleaseHandler<jaegertracing::thrift::AggregationValidatorIfFactory>::
  ~ReleaseHandler((ReleaseHandler<jaegertracing::thrift::AggregationValidatorIfFactory> *)
                  &handler.
                   super___shared_ptr<jaegertracing::thrift::AggregationValidatorIf,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount);
  sVar2.super___shared_ptr<apache::thrift::TProcessor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<apache::thrift::TProcessor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<apache::thrift::TProcessor>)
         sVar2.super___shared_ptr<apache::thrift::TProcessor,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

::apache::thrift::stdcxx::shared_ptr< ::apache::thrift::TProcessor > AggregationValidatorProcessorFactory::getProcessor(const ::apache::thrift::TConnectionInfo& connInfo) {
  ::apache::thrift::ReleaseHandler< AggregationValidatorIfFactory > cleanup(handlerFactory_);
  ::apache::thrift::stdcxx::shared_ptr< AggregationValidatorIf > handler(handlerFactory_->getHandler(connInfo), cleanup);
  ::apache::thrift::stdcxx::shared_ptr< ::apache::thrift::TProcessor > processor(new AggregationValidatorProcessor(handler));
  return processor;
}